

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall
cmCTestConfigureCommand::InitializeHandler(cmCTestConfigureCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  pointer pbVar3;
  bool bVar4;
  char *pcVar5;
  cmCTestGenericHandler *pcVar6;
  cmake *this_00;
  cmGlobalGenerator *pcVar7;
  ostream *poVar8;
  char *pcVar9;
  string *psVar10;
  string *option;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string cmakelists_file;
  string cmakeConfigureCommand;
  allocator<char> local_236;
  char local_235;
  uint local_234;
  string local_230;
  string local_210;
  char *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  cmCTestConfigureCommand *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostream local_1a8;
  
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar5 = (this->super_cmCTestHandlerCommand).Values.
           super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
           super__Vector_impl_data._M_start[7];
  if (pcVar5 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,pcVar5,(allocator<char> *)&local_210);
    cmSystemTools::ExpandListArgument((string *)&local_1a8,&local_1e8,false);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"BuildDirectory",(allocator<char> *)&local_1c8);
  cmCTest::GetCTestConfiguration((string *)&local_1a8,pcVar1,&local_210);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_210);
  if (local_1a8._8_8_ == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,
               "Build directory not specified. Either use BUILD argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY variable"
               ,(allocator<char> *)&local_210);
    cmCommand::SetError((cmCommand *)this,(string *)&local_1a8);
LAB_001a7aa5:
    psVar10 = (string *)&local_1a8;
LAB_001a7aad:
    std::__cxx11::string::~string((string *)psVar10);
  }
  else {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"CTEST_CONFIGURE_COMMAND",(allocator<char> *)&local_210);
    pcVar5 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 pcVar5,(this->super_cmCTestHandlerCommand).Quiet);
LAB_001a78a0:
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"CTEST_LABELS_FOR_SUBPROJECTS",(allocator<char> *)&local_210);
      pcVar5 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      if (pcVar5 != (char *)0x0) {
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                   "LabelsForSubprojects",pcVar5,(this->super_cmCTestHandlerCommand).Quiet);
      }
      pcVar6 = &cmCTest::GetConfigureHandler
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest)->
                super_cmCTestGenericHandler;
      (*((cmCTestGenericHandler *)&pcVar6->_vptr_cmCTestGenericHandler)->_vptr_cmCTestGenericHandler
        [3])(pcVar6);
      pcVar6->Quiet = (this->super_cmCTestHandlerCommand).Quiet;
      goto LAB_001a7ab5;
    }
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"CTEST_CMAKE_GENERATOR",(allocator<char> *)&local_210);
    pcVar5 = cmMakefile::GetDefinition(pcVar2,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,
                 "Configure command is not specified. If this is a \"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, set CTEST_CONFIGURE_COMMAND."
                 ,(allocator<char> *)&local_210);
      cmCommand::SetError((cmCommand *)this,(string *)&local_1a8);
      goto LAB_001a7aa5;
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1f0 = pcVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"SourceDirectory",(allocator<char> *)&local_1c8);
    cmCTest::GetCTestConfiguration(&local_210,pcVar1,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (local_210._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,
                 "Source directory not specified. Either use SOURCE argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY variable"
                 ,(allocator<char> *)&local_1c8);
      cmCommand::SetError((cmCommand *)this,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      psVar10 = &local_210;
      goto LAB_001a7aad;
    }
    std::operator+(&local_1c8,&local_210,"/CMakeLists.txt");
    local_235 = cmsys::SystemTools::FileExists(&local_1c8);
    if ((bool)local_235) {
      this_00 = cmMakefile::GetCMakeInstance
                          ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                           Makefile);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,local_1f0,(allocator<char> *)&local_230);
      pcVar7 = cmake::CreateGlobalGenerator(this_00,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      if (pcVar7 == (cmGlobalGenerator *)0x0) {
        local_234 = 0;
      }
      else {
        local_234 = (*pcVar7->_vptr_cmGlobalGenerator[0x23])(pcVar7);
        (*pcVar7->_vptr_cmGlobalGenerator[1])(pcVar7);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"\"",(allocator<char> *)&local_230);
      cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::append((string *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      pbVar3 = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar4 = false;
      local_1d0 = this;
      for (pbVar11 = local_1e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this = local_1d0, pbVar11 != pbVar3;
          pbVar11 = pbVar11 + 1) {
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
        pcVar5 = (pbVar11->_M_dataplus)._M_p;
        pcVar9 = strstr(pcVar5,"CMAKE_BUILD_TYPE=");
        if ((pcVar9 != (char *)0x0) ||
           (pcVar5 = strstr(pcVar5,"CMAKE_BUILD_TYPE:STRING="), pcVar5 != (char *)0x0)) {
          bVar4 = true;
        }
      }
      if (((local_234 & 1) == 0 && !bVar4) &&
         (psVar10 = cmCTest::GetConfigType_abi_cxx11_
                              ((local_1d0->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest),
         psVar10->_M_string_length != 0)) {
        std::__cxx11::string::append((char *)&local_1a8);
        cmCTest::GetConfigType_abi_cxx11_
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        std::__cxx11::string::append((string *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"CTEST_USE_LAUNCHERS",&local_236);
      bVar4 = cmMakefile::IsOn(pcVar2,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      if (bVar4) {
        std::__cxx11::string::append((char *)&local_1a8);
      }
      std::__cxx11::string::append((char *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"CTEST_CMAKE_GENERATOR_PLATFORM",&local_236);
      pcVar5 = cmMakefile::GetDefinition(pcVar2,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"CTEST_CMAKE_GENERATOR_TOOLSET",&local_236);
      pcVar5 = cmMakefile::GetDefinition(pcVar2,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::append((char *)&local_1a8);
      }
      std::__cxx11::string::append((char *)&local_1a8);
      std::__cxx11::string::append((string *)&local_1a8);
      std::__cxx11::string::append((char *)&local_1a8);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"ConfigureCommand",
                 (char *)local_1a8._vptr_basic_ostream,(this->super_cmCTestHandlerCommand).Quiet);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      poVar8 = std::operator<<(&local_1a8,"CMakeLists.txt file does not exist [");
      poVar8 = std::operator<<(poVar8,(string *)&local_1c8);
      std::operator<<(poVar8,"]");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_210);
    if (local_235 != '\0') goto LAB_001a78a0;
  }
  pcVar6 = (cmCTestGenericHandler *)0x0;
LAB_001a7ab5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return pcVar6;
}

Assistant:

cmCTestGenericHandler* cmCTestConfigureCommand::InitializeHandler()
{
  std::vector<std::string> options;

  if (this->Values[ctc_OPTIONS]) {
    cmSystemTools::ExpandListArgument(this->Values[ctc_OPTIONS], options);
  }

  if (this->CTest->GetCTestConfiguration("BuildDirectory").empty()) {
    this->SetError(
      "Build directory not specified. Either use BUILD "
      "argument to CTEST_CONFIGURE command or set CTEST_BINARY_DIRECTORY "
      "variable");
    return nullptr;
  }

  const char* ctestConfigureCommand =
    this->Makefile->GetDefinition("CTEST_CONFIGURE_COMMAND");

  if (ctestConfigureCommand && *ctestConfigureCommand) {
    this->CTest->SetCTestConfiguration("ConfigureCommand",
                                       ctestConfigureCommand, this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    if (cmakeGeneratorName && *cmakeGeneratorName) {
      const std::string& source_dir =
        this->CTest->GetCTestConfiguration("SourceDirectory");
      if (source_dir.empty()) {
        this->SetError(
          "Source directory not specified. Either use SOURCE "
          "argument to CTEST_CONFIGURE command or set CTEST_SOURCE_DIRECTORY "
          "variable");
        return nullptr;
      }

      const std::string cmakelists_file = source_dir + "/CMakeLists.txt";
      if (!cmSystemTools::FileExists(cmakelists_file)) {
        std::ostringstream e;
        e << "CMakeLists.txt file does not exist [" << cmakelists_file << "]";
        this->SetError(e.str());
        return nullptr;
      }

      bool multiConfig = false;
      bool cmakeBuildTypeInOptions = false;

      cmGlobalGenerator* gg =
        this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
          cmakeGeneratorName);
      if (gg) {
        multiConfig = gg->IsMultiConfig();
        delete gg;
      }

      std::string cmakeConfigureCommand = "\"";
      cmakeConfigureCommand += cmSystemTools::GetCMakeCommand();
      cmakeConfigureCommand += "\"";

      for (std::string const& option : options) {
        cmakeConfigureCommand += " \"";
        cmakeConfigureCommand += option;
        cmakeConfigureCommand += "\"";

        if ((nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE=")) ||
            (nullptr != strstr(option.c_str(), "CMAKE_BUILD_TYPE:STRING="))) {
          cmakeBuildTypeInOptions = true;
        }
      }

      if (!multiConfig && !cmakeBuildTypeInOptions &&
          !this->CTest->GetConfigType().empty()) {
        cmakeConfigureCommand += " \"-DCMAKE_BUILD_TYPE:STRING=";
        cmakeConfigureCommand += this->CTest->GetConfigType();
        cmakeConfigureCommand += "\"";
      }

      if (this->Makefile->IsOn("CTEST_USE_LAUNCHERS")) {
        cmakeConfigureCommand += " \"-DCTEST_USE_LAUNCHERS:BOOL=TRUE\"";
      }

      cmakeConfigureCommand += " \"-G";
      cmakeConfigureCommand += cmakeGeneratorName;
      cmakeConfigureCommand += "\"";

      const char* cmakeGeneratorPlatform =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_PLATFORM");
      if (cmakeGeneratorPlatform && *cmakeGeneratorPlatform) {
        cmakeConfigureCommand += " \"-A";
        cmakeConfigureCommand += cmakeGeneratorPlatform;
        cmakeConfigureCommand += "\"";
      }

      const char* cmakeGeneratorToolset =
        this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR_TOOLSET");
      if (cmakeGeneratorToolset && *cmakeGeneratorToolset) {
        cmakeConfigureCommand += " \"-T";
        cmakeConfigureCommand += cmakeGeneratorToolset;
        cmakeConfigureCommand += "\"";
      }

      cmakeConfigureCommand += " \"";
      cmakeConfigureCommand += source_dir;
      cmakeConfigureCommand += "\"";

      this->CTest->SetCTestConfiguration(
        "ConfigureCommand", cmakeConfigureCommand.c_str(), this->Quiet);
    } else {
      this->SetError(
        "Configure command is not specified. If this is a "
        "\"built with CMake\" project, set CTEST_CMAKE_GENERATOR. If not, "
        "set CTEST_CONFIGURE_COMMAND.");
      return nullptr;
    }
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  cmCTestConfigureHandler* handler = this->CTest->GetConfigureHandler();
  handler->Initialize();
  handler->SetQuiet(this->Quiet);
  return handler;
}